

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSat.c
# Opt level: O2

int Saig_RefManSetPhases(Saig_RefMan_t *p,Abc_Cex_t *pCare,int fValue1)

{
  undefined1 *puVar1;
  Abc_Cex_t *pAVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  Aig_Obj_t *pAVar6;
  int iVar7;
  ulong uVar8;
  int i;
  Aig_Man_t *p_00;
  int iVar9;
  uint uVar10;
  
  puVar1 = &p->pFrames->pConst1->field_0x18;
  *(ulong *)puVar1 = *(ulong *)puVar1 | 8;
  i = 0;
  iVar9 = 1;
  while( true ) {
    p_00 = p->pFrames;
    if (p_00->vCis->nSize <= i) break;
    pvVar5 = Vec_PtrEntry(p_00->vCis,i);
    iVar3 = Vec_IntEntry(p->vMapPiF2A,iVar9 + -1);
    iVar4 = Vec_IntEntry(p->vMapPiF2A,iVar9);
    pAVar2 = p->pCex;
    iVar7 = pAVar2->nRegs + iVar3 + pAVar2->nPis * iVar4;
    uVar8 = *(ulong *)((long)pvVar5 + 0x18) & 0xfffffffffffffff7;
    *(ulong *)((long)pvVar5 + 0x18) =
         uVar8 + (ulong)((uint)(&pAVar2[1].iPo)[iVar7 >> 5] >> ((byte)iVar7 & 0x1f) & 1) * 8;
    if ((pCare != (Abc_Cex_t *)0x0) &&
       (uVar10 = iVar3 + p->pCex->nRegs + iVar4 * p->pCex->nPis,
       ((uint)(&pCare[1].iPo)[(int)uVar10 >> 5] >> (uVar10 & 0x1f) & 1) == 0)) {
      *(ulong *)((long)pvVar5 + 0x18) = uVar8 | (fValue1 & 1U) << 3;
    }
    i = i + 1;
    iVar9 = iVar9 + 2;
  }
  for (iVar9 = 0; iVar9 < p_00->vObjs->nSize; iVar9 = iVar9 + 1) {
    pvVar5 = Vec_PtrEntry(p_00->vObjs,iVar9);
    if ((pvVar5 != (void *)0x0) && (0xfffffffd < ((uint)*(ulong *)((long)pvVar5 + 0x18) & 7) - 7)) {
      *(ulong *)((long)pvVar5 + 0x18) =
           (*(ulong *)((long)pvVar5 + 0x18) & 0xfffffffffffffff7) +
           (ulong)(((uint)*(ulong *)((long)pvVar5 + 0x10) ^
                   *(uint *)((*(ulong *)((long)pvVar5 + 0x10) & 0xfffffffffffffffe) + 0x18) >> 3) &
                   ((uint)*(ulong *)((long)pvVar5 + 8) ^
                   *(uint *)((*(ulong *)((long)pvVar5 + 8) & 0xfffffffffffffffe) + 0x18) >> 3) & 1)
           * 8;
    }
    p_00 = p->pFrames;
  }
  for (iVar9 = 0; iVar9 < p_00->vCos->nSize; iVar9 = iVar9 + 1) {
    pvVar5 = Vec_PtrEntry(p_00->vCos,iVar9);
    *(ulong *)((long)pvVar5 + 0x18) =
         *(ulong *)((long)pvVar5 + 0x18) & 0xfffffffffffffff7 |
         (ulong)(((int)*(ulong *)((long)pvVar5 + 8) << 3 ^
                 *(uint *)((*(ulong *)((long)pvVar5 + 8) & 0xfffffffffffffffe) + 0x18)) & 8);
    p_00 = p->pFrames;
  }
  pAVar6 = Aig_ManCo(p_00,0);
  return *(uint *)&pAVar6->field_0x18 >> 3 & 1;
}

Assistant:

int Saig_RefManSetPhases( Saig_RefMan_t * p, Abc_Cex_t * pCare, int fValue1 )
{
    Aig_Obj_t * pObj;
    int i, iFrame, iInput;
    Aig_ManConst1( p->pFrames )->fPhase = 1;
    Aig_ManForEachCi( p->pFrames, pObj, i )
    {
        iInput = Vec_IntEntry( p->vMapPiF2A, 2*i );
        iFrame = Vec_IntEntry( p->vMapPiF2A, 2*i+1 );
        pObj->fPhase = Abc_InfoHasBit( p->pCex->pData, p->pCex->nRegs + p->pCex->nPis * iFrame + iInput );
        // update value if it is a don't-care
        if ( pCare && !Abc_InfoHasBit( pCare->pData, p->pCex->nRegs + p->pCex->nPis * iFrame + iInput ) )
            pObj->fPhase = fValue1;
    }
    Aig_ManForEachNode( p->pFrames, pObj, i )
        pObj->fPhase = ( Aig_ObjFanin0(pObj)->fPhase ^ Aig_ObjFaninC0(pObj) )
                     & ( Aig_ObjFanin1(pObj)->fPhase ^ Aig_ObjFaninC1(pObj) );
    Aig_ManForEachCo( p->pFrames, pObj, i )
        pObj->fPhase = ( Aig_ObjFanin0(pObj)->fPhase ^ Aig_ObjFaninC0(pObj) );
    pObj = Aig_ManCo( p->pFrames, 0 );
    return pObj->fPhase;
}